

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_container.cpp
# Opt level: O0

void __thiscall
cppnet::TimerContainer::TimerContainer
          (TimerContainer *this,shared_ptr<cppnet::TimerContainer> *sub_timer,TIME_UNIT unit,
          TIME_UNIT max)

{
  TIME_UNIT max_local;
  TIME_UNIT unit_local;
  shared_ptr<cppnet::TimerContainer> *sub_timer_local;
  TimerContainer *this_local;
  
  Timer::Timer(&this->super_Timer);
  (this->super_Timer)._vptr_Timer = (_func_int **)&PTR_AddTimer_00166a50;
  this->_time_unit = unit;
  this->_size = max / unit;
  this->_timer_max = max;
  this->_cur_time = 0;
  Bitmap::Bitmap(&this->_bitmap);
  std::weak_ptr<cppnet::TimerContainer>::weak_ptr(&this->_root_timer);
  std::shared_ptr<cppnet::TimerContainer>::shared_ptr(&this->_sub_timer,sub_timer);
  std::
  unordered_map<unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>_>_>
  ::unordered_map(&this->_timer_wheel);
  Bitmap::Init(&this->_bitmap,this->_size);
  return;
}

Assistant:

TimerContainer::TimerContainer(std::shared_ptr<TimerContainer> sub_timer, TIME_UNIT unit, TIME_UNIT max):
    _time_unit(unit),
    _size(max / unit),
    _timer_max(max),
    _cur_time(0),
    _sub_timer(sub_timer) {

    _bitmap.Init(_size);
}